

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.h
# Opt level: O0

uint32 __thiscall Clasp::Asp::Preprocessor::nextBodyId(Preprocessor *this,size_type *idx)

{
  size_type sVar1;
  uint32 uVar2;
  bool bVar3;
  size_type sVar4;
  reference puVar5;
  size_type *in_RSI;
  long in_RDI;
  uint32 id;
  
  bVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8));
  if ((!bVar3) &&
     (sVar1 = *in_RSI,
     sVar4 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8)),
     sVar1 != sVar4)) {
    if ((*(byte *)(in_RDI + 0x44) & 1) != 0) {
      puVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                         ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8));
      uVar2 = *puVar5;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8));
      return uVar2;
    }
    sVar1 = *in_RSI;
    *in_RSI = sVar1 + 1;
    puVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                        sVar1);
    return *puVar5;
  }
  return 0x40000000;
}

Assistant:

uint32   nextBodyId(VarVec::size_type& idx) {
		if (follow_.empty() || idx == follow_.size()) { return varMax; }
		if (dfs_) {
			uint32 id = follow_.back();
			follow_.pop_back();
			return id;
		}
		return follow_[idx++];;
	}